

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O1

duckdb_state duckdb_appender_add_column(duckdb_appender appender,char *name)

{
  type pAVar1;
  duckdb_state dVar2;
  ErrorData error;
  allocator local_c1;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [144];
  
  dVar2 = DuckDBError;
  if ((appender != (duckdb_appender)0x0) && (*(long *)appender != 0)) {
    pAVar1 = duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::
             operator*((unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true> *)
                       appender);
    std::__cxx11::string::string((string *)local_c0,name,&local_c1);
    (*(pAVar1->super_BaseAppender)._vptr_BaseAppender[2])(pAVar1,local_c0);
    if (local_c0[0] != local_b0) {
      operator_delete(local_c0[0]);
    }
    dVar2 = DuckDBSuccess;
  }
  return dVar2;
}

Assistant:

duckdb_state duckdb_appender_add_column(duckdb_appender appender, const char *name) {
	return duckdb_appender_run_function(appender, [&](Appender &appender) { appender.AddColumn(name); });
}